

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O3

ON_wString __thiscall
ON_FileSystemPath::RemoveVolumeName(ON_FileSystemPath *this,wchar_t *path,ON_wString *volume_name)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  int length;
  wchar_t *dir;
  ON_wString local_40;
  ON_wString local_path;
  wchar_t *fext;
  wchar_t *fname;
  wchar_t *vol;
  
  CleanPath((ON_FileSystemPath *)&local_path,true,true,true,true,false,L'/',path);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_path);
  vol = (wchar_t *)0x0;
  dir = (wchar_t *)0x0;
  fname = (wchar_t *)0x0;
  fext = (wchar_t *)0x0;
  on_wsplitpath(pwVar2,&vol,&dir,&fname,&fext);
  pwVar2 = dir;
  pwVar1 = dir;
  if (((dir == (wchar_t *)0x0) && (pwVar2 = fname, pwVar1 = fname, fname == (wchar_t *)0x0)) &&
     (pwVar2 = fext, pwVar1 = fext, fext == (wchar_t *)0x0)) {
    pwVar2 = (wchar_t *)0x0;
    pwVar1 = dir;
  }
  dir = pwVar1;
  if (volume_name != (ON_wString *)0x0) {
    length = (int)((ulong)((long)pwVar2 - (long)vol) >> 2);
    if (((pwVar2 < vol || (long)pwVar2 - (long)vol == 0) || vol == (wchar_t *)0x0) || length == 0) {
      ON_wString::operator=(volume_name,&ON_wString::EmptyString);
    }
    else {
      ON_wString::ON_wString(&local_40,vol,length);
      ON_wString::operator=(volume_name,&local_40);
      ON_wString::~ON_wString(&local_40);
    }
  }
  ON_wString::ON_wString((ON_wString *)this,dir);
  ON_wString::~ON_wString(&local_path);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::RemoveVolumeName(
  const wchar_t* path,
  ON_wString* volume_name
)
{
  const ON_wString local_path = ON_FileSystemPath::CleanPath(path);
  path = static_cast<const wchar_t*>(local_path);
  const wchar_t* vol = nullptr;
  const wchar_t* dir = nullptr;
  const wchar_t* fname = nullptr;
  const wchar_t* fext = nullptr;
  on_wsplitpath(path, &vol, &dir, &fname, &fext);
  if (nullptr == dir)
  {
    if (nullptr != fname)
      dir = fname;
    else if (nullptr != fext)
      dir = fext;
  }

  if (nullptr != volume_name)
  {
    size_t length
      = (nullptr != vol && nullptr != dir && vol < dir)
      ? (int)(dir - vol)
      : 0;
    if (length > 0)
      *volume_name = ON_wString(vol, (int)length);
    else
      *volume_name = ON_wString::EmptyString;
  }
  return ON_wString(dir);
}